

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aabbox3d.h
# Opt level: O2

void __thiscall irr::core::aabbox3d<float>::getEdges(aabbox3d<float> *this,vector3d<float> *edges)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  vector3d<float> vVar6;
  vector3d<float> local_28;
  
  local_28 = getCenter(this);
  vVar6 = vector3d<float>::operator-(&local_28,&this->MaxEdge);
  fVar3 = vVar6.Z + local_28.Z;
  fVar4 = local_28.X + vVar6.X;
  fVar5 = local_28.Y + vVar6.Y;
  edges->X = fVar4;
  edges->Y = fVar5;
  edges->Z = fVar3;
  edges[1].X = fVar4;
  edges[1].Z = fVar3;
  fVar1 = local_28.Z - vVar6.Z;
  edges[2].X = fVar4;
  edges[2].Y = fVar5;
  edges[2].Z = fVar1;
  edges[3].X = fVar4;
  edges[3].Z = fVar1;
  edges[4].Y = fVar5;
  edges[4].Z = fVar3;
  fVar4 = local_28.X - vVar6.X;
  fVar2 = local_28.Y - vVar6.Y;
  edges[1].Y = fVar2;
  edges[3].Y = fVar2;
  edges[4].X = fVar4;
  edges[5].X = fVar4;
  edges[5].Y = fVar2;
  edges[5].Z = fVar3;
  edges[6].X = fVar4;
  edges[6].Y = fVar5;
  edges[6].Z = fVar1;
  edges[7].X = fVar4;
  edges[7].Y = fVar2;
  edges[7].Z = fVar1;
  return;
}

Assistant:

void getEdges(vector3d<T> *edges) const
	{
		const core::vector3d<T> middle = getCenter();
		const core::vector3d<T> diag = middle - MaxEdge;

		/*
		Edges are stored in this way:
		Hey, am I an ascii artist, or what? :) niko.
			   /3--------/7
			  / |       / |
			 /  |      /  |
			1---------5   |
			|  /2- - -|- -6
			| /       |  /
			|/        | /
			0---------4/
		*/

		edges[0].set(middle.X + diag.X, middle.Y + diag.Y, middle.Z + diag.Z);
		edges[1].set(middle.X + diag.X, middle.Y - diag.Y, middle.Z + diag.Z);
		edges[2].set(middle.X + diag.X, middle.Y + diag.Y, middle.Z - diag.Z);
		edges[3].set(middle.X + diag.X, middle.Y - diag.Y, middle.Z - diag.Z);
		edges[4].set(middle.X - diag.X, middle.Y + diag.Y, middle.Z + diag.Z);
		edges[5].set(middle.X - diag.X, middle.Y - diag.Y, middle.Z + diag.Z);
		edges[6].set(middle.X - diag.X, middle.Y + diag.Y, middle.Z - diag.Z);
		edges[7].set(middle.X - diag.X, middle.Y - diag.Y, middle.Z - diag.Z);
	}